

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QWizardPage::cleanupPage(QWizardPage *this)

{
  long lVar1;
  QVariant *pQVar2;
  QVariant *pQVar3;
  long lVar4;
  
  lVar1 = *(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600);
  if (lVar1 != 0) {
    lVar1 = *(long *)(lVar1 + 8);
    lVar4 = *(long *)(lVar1 + 0x2f8);
    if (lVar4 != 0) {
      pQVar3 = (QVariant *)(*(long *)(lVar1 + 0x2f0) + 0x60);
      lVar4 = lVar4 << 7;
      do {
        if (pQVar3[-3].d.data.shared == (PrivateShared *)this) {
          pQVar2 = *(QVariant **)&pQVar3[-2].d.field_0x18;
          if (pQVar2 == (QVariant *)0x0) {
            pQVar2 = (QVariant *)&QByteArray::_empty;
          }
          QObject::doSetProperty(*(char **)((long)&pQVar3[-2].d.data + 8),pQVar2,pQVar3);
        }
        pQVar3 = pQVar3 + 4;
        lVar4 = lVar4 + -0x80;
      } while (lVar4 != 0);
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }